

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::GenGetter_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,Type *type)

{
  BaseType BVar1;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Type local_58;
  allocator<char> local_35 [20];
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  PythonGenerator *this_local;
  
  BVar1 = type->base_type;
  local_20 = type;
  type_local = (Type *)this;
  this_local = (PythonGenerator *)__return_storage_ptr__;
  if (BVar1 == BASE_TYPE_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"self._tab.String(",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  else if (BVar1 == BASE_TYPE_VECTOR) {
    Type::VectorType(&local_58,type);
    GenGetter_abi_cxx11_(__return_storage_ptr__,this,&local_58);
  }
  else if (BVar1 == BASE_TYPE_UNION) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"self._tab.Union(",local_35);
    std::allocator<char>::~allocator(local_35);
  }
  else {
    GenTypeGet_abi_cxx11_(&local_b8,this,type);
    Namer::Method(&local_98,&(this->namer_).super_Namer,&local_b8);
    std::operator+(&local_78,"self._tab.Get(flatbuffers.number_types.",&local_98);
    std::operator+(__return_storage_ptr__,&local_78,"Flags, ");
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenGetter(const Type &type) const {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "self._tab.String(";
      case BASE_TYPE_UNION: return "self._tab.Union(";
      case BASE_TYPE_VECTOR: return GenGetter(type.VectorType());
      default:
        return "self._tab.Get(flatbuffers.number_types." +
               namer_.Method(GenTypeGet(type)) + "Flags, ";
    }
  }